

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void * arg_hashtable_search(arg_hashtable_t *h,void *k)

{
  uint hashvalue_00;
  uint uVar1;
  int iVar2;
  uint index;
  uint hashvalue;
  arg_hashtable_entry *e;
  void *k_local;
  arg_hashtable_t *h_local;
  
  hashvalue_00 = enhanced_hash(h,k);
  uVar1 = index_for(h->tablelength,hashvalue_00);
  _index = h->table[uVar1];
  while( true ) {
    if (_index == (arg_hashtable_entry *)0x0) {
      return (void *)0x0;
    }
    if ((hashvalue_00 == _index->h) && (iVar2 = (*h->eqfn)(k,_index->k), iVar2 != 0)) break;
    _index = _index->next;
  }
  return _index->v;
}

Assistant:

void* arg_hashtable_search(arg_hashtable_t* h, const void* k) {
    struct arg_hashtable_entry* e;
    unsigned int hashvalue;
    unsigned int index;

    hashvalue = enhanced_hash(h, k);
    index = index_for(h->tablelength, hashvalue);
    e = h->table[index];
    while (e != NULL) {
        /* Check hash value to short circuit heavier comparison */
        if ((hashvalue == e->h) && (h->eqfn(k, e->k)))
            return e->v;
        e = e->next;
    }
    return NULL;
}